

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
              (char **begin,char *end,
              id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
              *eh)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  
  pbVar1 = (byte *)*begin;
  if ((pbVar1 == (byte *)end) || (bVar2 = *pbVar1, 9 < (byte)(bVar2 - 0x30))) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format.h"
                ,0x816,"");
  }
  uVar3 = 0;
  do {
    pbVar1 = pbVar1 + 1;
    if (0xccccccc < uVar3) {
      uVar3 = 0x80000000;
      goto LAB_001169cf;
    }
    uVar3 = (uVar3 * 10 + (uint)bVar2) - 0x30;
    *begin = (char *)pbVar1;
  } while ((pbVar1 != (byte *)end) && (bVar2 = *pbVar1, (byte)(bVar2 - 0x30) < 10));
  if ((int)uVar3 < 0) {
LAB_001169cf:
    id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
    ::on_error(eh,"number is too big");
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}